

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<unsigned_short,unsigned_short,unsigned_short,unsigned_short,unsigned_short>
               (ostream *out,char *fmt,unsigned_short *args,unsigned_short *args_1,
               unsigned_short *args_2,unsigned_short *args_3,unsigned_short *args_4)

{
  long in_FS_OFFSET;
  FormatList local_90;
  FormatArg local_80;
  unsigned_short *local_68;
  code *local_60;
  code *local_58;
  unsigned_short *local_50;
  code *local_48;
  code *local_40;
  unsigned_short *local_38;
  code *local_30;
  code *local_28;
  unsigned_short *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.m_args = &local_80;
  local_90.m_N = 5;
  local_80.m_formatImpl = detail::FormatArg::formatImpl<unsigned_short>;
  local_80.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_short>;
  local_60 = detail::FormatArg::formatImpl<unsigned_short>;
  local_58 = detail::FormatArg::toIntImpl<unsigned_short>;
  local_48 = detail::FormatArg::formatImpl<unsigned_short>;
  local_40 = detail::FormatArg::toIntImpl<unsigned_short>;
  local_30 = detail::FormatArg::formatImpl<unsigned_short>;
  local_28 = detail::FormatArg::toIntImpl<unsigned_short>;
  local_20 = args_4;
  local_18 = detail::FormatArg::formatImpl<unsigned_short>;
  local_10 = detail::FormatArg::toIntImpl<unsigned_short>;
  local_80.m_value = args;
  local_68 = args_1;
  local_50 = args_2;
  local_38 = args_3;
  vformat(out,fmt,&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}